

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aalcalc.cpp
# Opt level: O0

void __thiscall aalcalc::getsamplesizes(aalcalc *this)

{
  mapped_type *pmVar1;
  byte bVar2;
  int local_18;
  int local_14;
  aalcalc *paStack_10;
  int i;
  aalcalc *this_local;
  
  paStack_10 = this;
  if (((this->alct_output_ & 1U) != 0) && (1 < this->samplesize_)) {
    local_14 = 0;
    while (bVar2 = (byte)local_14,
          (1 << (bVar2 & 0x1f)) + (1 << (bVar2 & 0x1f)) + -1 <= this->samplesize_) {
      local_18 = 1 << (bVar2 & 0x1f);
      pmVar1 = std::
               map<int,_std::vector<aal_rec_period,_std::allocator<aal_rec_period>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aal_rec_period,_std::allocator<aal_rec_period>_>_>_>_>
               ::operator[](&this->vec_sample_aal_,&local_18);
      std::vector<aal_rec_period,_std::allocator<aal_rec_period>_>::resize
                (pmVar1,(long)(this->max_summary_id_ + 1));
      local_14 = local_14 + 1;
    }
  }
  pmVar1 = std::
           map<int,_std::vector<aal_rec_period,_std::allocator<aal_rec_period>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aal_rec_period,_std::allocator<aal_rec_period>_>_>_>_>
           ::operator[](&this->vec_sample_aal_,&this->samplesize_);
  std::vector<aal_rec_period,_std::allocator<aal_rec_period>_>::resize
            (pmVar1,(long)(this->max_summary_id_ + 1));
  return;
}

Assistant:

void aalcalc::getsamplesizes()
{
	// Sample size subsets are fixed and non-overlapping, increasing in size
	// by a factor of 2^n, where n = subset number,
	// i.e. for 10 samples, sets are (1), (2, 3), (4, 5, 6, 7)
	// for 20 samples, sets are (1), (2, 3), (4, 5, 6, 7),
	//                          (8, 9, 10, 11, 12, 13, 14, 15)
	if (alct_output_ && samplesize_ > 1) {
		int i = 0;
		while (((1 << i) + ((1 << i) - 1)) <= samplesize_) {
			vec_sample_aal_[1 << i].resize(max_summary_id_ + 1);
			i++;
		}
	}
	vec_sample_aal_[samplesize_].resize(max_summary_id_ + 1);
}